

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

void __thiscall aeron::archive::AeronArchive::AeronArchive(AeronArchive *this,Context *ctx)

{
  Aeron *this_00;
  element_type *peVar1;
  ArchiveProxy *this_01;
  AeronArchive *pAVar2;
  undefined8 uVar3;
  element_type *peVar4;
  element_type *peVar5;
  int32_t iVar6;
  uint uVar7;
  int iVar8;
  int64_t iVar9;
  __shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2> *p_Var10;
  string *psVar11;
  ArchiveException *this_02;
  char *pcVar12;
  allocator local_ea;
  allocator local_e9;
  shared_ptr<aeron::Aeron> *local_e8;
  AeronArchive *local_e0;
  undefined1 local_d8 [32];
  shared_ptr<aeron::Subscription> subscription;
  shared_ptr<aeron::ExclusivePublication> publication;
  string local_70;
  string local_50;
  
  Context::Context(&this->ctx_,ctx);
  *(undefined8 *)((long)&(this->lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock_).super___mutex_base._M_mutex + 8) = 0;
  (this->lock_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->archiveProxy_)._M_t.
  super___uniq_ptr_impl<aeron::archive::ArchiveProxy,_std::default_delete<aeron::archive::ArchiveProxy>_>
  ._M_t.
  super__Tuple_impl<0UL,_aeron::archive::ArchiveProxy_*,_std::default_delete<aeron::archive::ArchiveProxy>_>
  .super__Head_base<0UL,_aeron::archive::ArchiveProxy_*,_false>._M_head_impl = (ArchiveProxy *)0x0;
  (this->controlResponsePoller_)._M_t.
  super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
  ._M_t.
  super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
  .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>._M_head_impl =
       (ControlResponsePoller *)0x0;
  (this->recordingDescriptorPoller_)._M_t.
  super___uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
  ._M_t.
  super__Tuple_impl<0UL,_aeron::archive::RecordingDescriptorPoller_*,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
  .super__Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false>._M_head_impl =
       (RecordingDescriptorPoller *)0x0;
  (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e0 = this;
  iVar9 = Context::messageTimeoutNs(&this->ctx_);
  (this->messageTimeoutNs_).__r = iVar9;
  Context::conclude(&this->ctx_);
  p_Var10 = &Context::aeron(&this->ctx_)->
             super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>;
  local_e8 = &this->aeron_;
  std::__shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_e8->super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>,p_Var10);
  this_00 = (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar11 = Context::controlResponseChannel_abi_cxx11_(&this->ctx_);
  iVar6 = Context::controlResponseStreamId(&this->ctx_);
  Aeron::addSubscription(this_00,psVar11,iVar6);
  subscription.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  subscription.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    ClientConductor::findSubscription
              ((ClientConductor *)local_d8,
               (int64_t)&((local_e8->super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->m_conductor);
    std::__shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&subscription.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2> *)local_d8);
    peVar4 = subscription.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
    if (peVar4 != (element_type *)0x0) break;
    sched_yield();
  }
  std::
  make_unique<aeron::archive::ControlResponsePoller,std::shared_ptr<aeron::Subscription>&,int_const&>
            ((shared_ptr<aeron::Subscription> *)local_d8,(int *)&subscription);
  uVar3 = local_d8._0_8_;
  local_d8._0_8_ =
       (__uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
        )0x0;
  std::
  __uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
  ::reset((__uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
           *)&this->controlResponsePoller_,(pointer)uVar3);
  std::
  unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
  ::~unique_ptr((unique_ptr<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                 *)local_d8);
  pAVar2 = local_e0;
  peVar1 = (local_e0->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar11 = Context::controlRequestChannel_abi_cxx11_(&local_e0->ctx_);
  iVar6 = Context::controlRequestStreamId(&pAVar2->ctx_);
  ClientConductor::addExclusivePublication(&peVar1->m_conductor,psVar11,iVar6);
  publication.super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  publication.super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    ClientConductor::findExclusivePublication
              ((ClientConductor *)local_d8,
               (int64_t)&((local_e8->super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->m_conductor);
    std::__shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&publication.
                super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2> *)local_d8);
    peVar5 = publication.super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
    pAVar2 = local_e0;
    if (peVar5 != (element_type *)0x0) break;
    sched_yield();
  }
  local_70._M_dataplus._M_p = (pointer)Context::messageTimeoutNs(&local_e0->ctx_);
  std::
  make_unique<aeron::archive::ArchiveProxy,std::shared_ptr<aeron::ExclusivePublication>&,long,int_const&>
            ((shared_ptr<aeron::ExclusivePublication> *)local_d8,(long *)&publication,
             (int *)&local_70);
  uVar3 = local_d8._0_8_;
  local_d8._0_8_ =
       (__uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
        )0x0;
  std::
  __uniq_ptr_impl<aeron::archive::ArchiveProxy,_std::default_delete<aeron::archive::ArchiveProxy>_>
  ::reset((__uniq_ptr_impl<aeron::archive::ArchiveProxy,_std::default_delete<aeron::archive::ArchiveProxy>_>
           *)&this->archiveProxy_,(pointer)uVar3);
  std::unique_ptr<aeron::archive::ArchiveProxy,_std::default_delete<aeron::archive::ArchiveProxy>_>
  ::~unique_ptr((unique_ptr<aeron::archive::ArchiveProxy,_std::default_delete<aeron::archive::ArchiveProxy>_>
                 *)local_d8);
  iVar9 = concurrent::ringbuffer::ManyToOneRingBuffer::nextCorrelationId
                    (&((local_e8->super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->m_toDriverRingBuffer);
  this_01 = (pAVar2->archiveProxy_)._M_t.
            super___uniq_ptr_impl<aeron::archive::ArchiveProxy,_std::default_delete<aeron::archive::ArchiveProxy>_>
            ._M_t.
            super__Tuple_impl<0UL,_aeron::archive::ArchiveProxy_*,_std::default_delete<aeron::archive::ArchiveProxy>_>
            .super__Head_base<0UL,_aeron::archive::ArchiveProxy_*,_false>._M_head_impl;
  psVar11 = Context::controlResponseChannel_abi_cxx11_(&pAVar2->ctx_);
  uVar7 = Context::controlResponseStreamId(&pAVar2->ctx_);
  iVar8 = ArchiveProxy::connect(this_01,(int)psVar11,(sockaddr *)(ulong)uVar7,(socklen_t)iVar9);
  if ((char)iVar8 != '\0') {
    iVar9 = awaitSessionOpened(pAVar2,iVar9);
    pAVar2->controlSessionId_ = iVar9;
    std::
    make_unique<aeron::archive::RecordingDescriptorPoller,std::shared_ptr<aeron::Subscription>&,int_const&,long&>
              ((shared_ptr<aeron::Subscription> *)local_d8,(int *)&subscription,
               (long *)&(anonymous_namespace)::FRAGMENT_LIMIT);
    uVar3 = local_d8._0_8_;
    local_d8._0_8_ =
         (__uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
          )0x0;
    std::
    __uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
    ::reset((__uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
             *)&this->recordingDescriptorPoller_,(pointer)uVar3);
    std::
    unique_ptr<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
    ::~unique_ptr((unique_ptr<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
                   *)local_d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&publication.
                super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&subscription.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return;
  }
  this_02 = (ArchiveException *)__cxa_allocate_exception(0x48);
  psVar11 = Context::controlResponseChannel_abi_cxx11_(&pAVar2->ctx_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 "cannot connect to archive: ",psVar11);
  std::__cxx11::string::string
            ((string *)&local_70,"aeron::archive::AeronArchive::AeronArchive(const Context &)",
             &local_e9);
  pcVar12 = aeron::util::past_prefix
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                      );
  std::__cxx11::string::string((string *)&local_50,pcVar12,&local_ea);
  ArchiveException::ArchiveException(this_02,(string *)local_d8,&local_70,&local_50,0x40);
  __cxa_throw(this_02,&ArchiveException::typeinfo,aeron::util::SourcedException::~SourcedException);
}

Assistant:

AeronArchive::AeronArchive(const Context& ctx)
    : ctx_(ctx)
    , messageTimeoutNs_(ctx_.messageTimeoutNs()) {
    ctx_.conclude();

    aeron_ = ctx_.aeron();
    // aeronClientInvoker_ = aeron_->conductorAgentInvoker();
    // TODO: get it from the context: idleStrategy_ = ...

    std::int64_t subId = aeron_->addSubscription(ctx_.controlResponseChannel(), ctx_.controlResponseStreamId());
    std::shared_ptr<Subscription> subscription;
    while (!(subscription = aeron_->findSubscription(subId))) {
        std::this_thread::yield();
    }

    controlResponsePoller_ = std::make_unique<ControlResponsePoller>(subscription, FRAGMENT_LIMIT);

    std::int64_t pubId = aeron_->addExclusivePublication(ctx_.controlRequestChannel(), ctx_.controlRequestStreamId());
    std::shared_ptr<ExclusivePublication> publication;
    while (!(publication = aeron_->findExclusivePublication(pubId))) {
        std::this_thread::yield();
    }

    archiveProxy_ = std::make_unique<ArchiveProxy>(publication, ctx_.messageTimeoutNs(), DEFAULT_RETRY_ATTEMPTS);

    std::int64_t correlationId = aeron_->nextCorrelationId();
    if (!archiveProxy_->connect(ctx_.controlResponseChannel(), ctx_.controlResponseStreamId(), correlationId,
                                aeron_->conductorAgentInvoker())) {
        throw ArchiveException("cannot connect to archive: " + ctx_.controlResponseChannel(), SOURCEINFO);
    }

    controlSessionId_ = awaitSessionOpened(correlationId);
    recordingDescriptorPoller_ =
        std::make_unique<RecordingDescriptorPoller>(subscription, FRAGMENT_LIMIT, controlSessionId_);
}